

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopinv.cpp
# Opt level: O1

unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
* __thiscall
mocker::LoopInvariantCodeMotion::findLoopInvariantComputation
          (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           *__return_storage_ptr__,LoopInvariantCodeMotion *this,size_t header,UseDefChain *useDef)

{
  _List_node_base *p_Var1;
  __buckets_ptr pp_Var2;
  ulong uVar3;
  _Hash_node_base *p_Var4;
  __node_base_ptr p_Var5;
  pointer psVar6;
  mapped_type *pmVar7;
  BasicBlock *pBVar8;
  const_iterator cVar9;
  element_type *peVar10;
  const_iterator cVar11;
  __node_base_ptr p_Var12;
  size_t *psVar13;
  __node_base_ptr p_Var14;
  __node_base_ptr p_Var15;
  __node_base_ptr p_Var16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _List_node_base *p_Var17;
  _List_node_base *p_Var18;
  bool bVar19;
  vector<unsigned_long,_std::allocator<unsigned_long>_> mustPass;
  shared_ptr<mocker::ir::IRInst> def;
  value_type inst;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  operands;
  shared_ptr<mocker::ir::Reg> reg;
  function<void_(unsigned_long)> visit;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  related;
  queue<std::shared_ptr<mocker::ir::IRInst>,_std::deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>_>
  worklist;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  res;
  RegSet loopInvVars;
  size_t *local_1e8;
  size_t *psStack_1e0;
  long local_1d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c8;
  shared_ptr<mocker::ir::IRInst> local_1c0;
  shared_ptr<mocker::ir::IRInst> local_1b0;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  local_1a0;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_188;
  size_t *local_180;
  _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_178;
  long local_170;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_168;
  size_t local_160;
  _Any_data local_158;
  code *local_148;
  code *pcStack_140;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_130;
  _Deque_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
  local_f8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a0;
  _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Reg>,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>,_std::__detail::_Identity,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_178 = (_Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)useDef;
  local_160 = header;
  pmVar7 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&this->loopTree,&local_160);
  local_a0._M_buckets = &local_a0._M_single_bucket;
  local_a0._M_bucket_count = 1;
  local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a0._M_element_count = 0;
  local_a0._M_rehash_policy._M_max_load_factor = 1.0;
  local_a0._M_rehash_policy._M_next_resize = 0;
  local_a0._M_single_bucket = (__node_base_ptr)0x0;
  LoopInfo::getLoopInvariantVariables((RegSet *)&local_68,&this->loopTree,local_160);
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
  ::_M_initialize_map(&local_f8,0);
  pBVar8 = ir::FunctionModule::getBasicBlock((this->super_FuncPass).func,local_160);
  p_Var18 = (pBVar8->insts).
            super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
            ._M_impl._M_node.super__List_node_base._M_prev;
  p_Var1 = p_Var18[1]._M_next;
  local_1c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var18[1]._M_prev;
  if (local_1c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_1c8->_M_use_count = local_1c8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_1c8->_M_use_count = local_1c8->_M_use_count + 1;
    }
  }
  p_Var18 = (p_Var1[2]._M_prev)->_M_prev;
  p_Var1 = (p_Var1[3]._M_prev)->_M_prev;
  pp_Var2 = (pmVar7->_M_h)._M_buckets;
  uVar3 = (pmVar7->_M_h)._M_bucket_count;
  p_Var14 = pp_Var2[(ulong)p_Var1 % uVar3];
  p_Var16 = (__node_base_ptr)0x0;
  if ((p_Var14 != (__node_base_ptr)0x0) &&
     (p_Var4 = p_Var14->_M_nxt, p_Var16 = p_Var14,
     p_Var1 != (_List_node_base *)p_Var14->_M_nxt[1]._M_nxt)) {
    while (p_Var14 = p_Var4, p_Var4 = p_Var14->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
      p_Var16 = (__node_base_ptr)0x0;
      if (((ulong)p_Var4[1]._M_nxt % uVar3 != (ulong)p_Var1 % uVar3) ||
         (p_Var16 = p_Var14, p_Var1 == (_List_node_base *)p_Var4[1]._M_nxt)) goto LAB_0011274c;
    }
    p_Var16 = (__node_base_ptr)0x0;
  }
LAB_0011274c:
  if (p_Var16 == (__node_base_ptr)0x0) {
    bVar19 = false;
  }
  else {
    bVar19 = p_Var16->_M_nxt != (_Hash_node_base *)0x0;
  }
  p_Var17 = p_Var18;
  if (bVar19) {
    p_Var17 = p_Var1;
    p_Var1 = p_Var18;
  }
  p_Var14 = pp_Var2[(ulong)p_Var1 % uVar3];
  p_Var16 = (__node_base_ptr)0x0;
  if ((p_Var14 != (__node_base_ptr)0x0) &&
     (p_Var4 = p_Var14->_M_nxt, p_Var16 = p_Var14,
     p_Var1 != (_List_node_base *)p_Var14->_M_nxt[1]._M_nxt)) {
    while (p_Var14 = p_Var4, p_Var4 = p_Var14->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
      p_Var16 = (__node_base_ptr)0x0;
      if (((ulong)p_Var4[1]._M_nxt % uVar3 != (ulong)p_Var1 % uVar3) ||
         (p_Var16 = p_Var14, p_Var1 == (_List_node_base *)p_Var4[1]._M_nxt)) goto LAB_001127bb;
    }
    p_Var16 = (__node_base_ptr)0x0;
  }
LAB_001127bb:
  if ((p_Var16 == (__node_base_ptr)0x0) || (p_Var16->_M_nxt == (_Hash_node_base *)0x0)) {
    local_1e8 = (size_t *)0x0;
    psStack_1e0 = (size_t *)0x0;
    local_1d8 = 0;
    local_148 = (code *)0x0;
    pcStack_140 = (code *)0x0;
    local_158._M_unused._M_object = (void *)0x0;
    local_158._8_8_ = 0;
    local_158._M_unused._M_object = operator_new(0x18);
    *(_Any_data **)local_158._M_unused._0_8_ = &local_158;
    *(size_t ***)((long)local_158._M_unused._0_8_ + 8) = &local_1e8;
    *(LoopInvariantCodeMotion **)((long)local_158._M_unused._0_8_ + 0x10) = this;
    pcStack_140 = std::
                  _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/loopinv.cpp:149:44)>
                  ::_M_invoke;
    local_148 = std::
                _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/loopinv.cpp:149:44)>
                ::_M_manager;
    local_130._M_buckets = (__buckets_ptr)p_Var17;
    std::
    _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/loopinv.cpp:149:44)>
    ::_M_invoke(&local_158,(unsigned_long *)&local_130);
    local_180 = psStack_1e0;
    local_188 = &__return_storage_ptr__->_M_h;
    if (local_1e8 != psStack_1e0) {
      psVar13 = local_1e8;
      do {
        pBVar8 = ir::FunctionModule::getBasicBlock((this->super_FuncPass).func,*psVar13);
        for (p_Var18 = (pBVar8->insts).
                       super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next;
            p_Var18 != (_List_node_base *)&pBVar8->insts; p_Var18 = p_Var18->_M_next) {
          p_Var1 = p_Var18 + 1;
          ir::getDest((ir *)&local_130,(shared_ptr<mocker::ir::IRInst> *)p_Var1);
          if (((_List_node_base *)local_130._M_buckets != (_List_node_base *)0x0) &&
             (cVar9 = std::
                      _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Reg>,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>,_std::__detail::_Identity,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::find(&local_68,(key_type *)&local_130),
             cVar9.super__Node_iterator_base<std::shared_ptr<mocker::ir::Reg>,_true>._M_cur !=
             (__node_type *)0x0)) {
            local_1a0.
            super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)((__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)
                          &p_Var1->_M_next)->_M_ptr;
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::_M_emplace<unsigned_long>(&local_a0,&local_1a0);
            peVar10 = ((__shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2> *)
                      &p_Var1->_M_next)->_M_ptr;
            if (peVar10->type == Call) {
              this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var18[1]._M_prev;
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  this_00->_M_use_count = this_00->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  this_00->_M_use_count = this_00->_M_use_count + 1;
                }
              }
            }
            else {
              peVar10 = (element_type *)0x0;
              this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            if (peVar10 != (element_type *)0x0) {
              std::
              deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
              ::emplace_back<std::shared_ptr<mocker::ir::IRInst>const&>
                        ((deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
                          *)&local_f8,(shared_ptr<mocker::ir::IRInst> *)p_Var1);
            }
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            }
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._M_bucket_count !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._M_bucket_count);
          }
        }
        psVar13 = psVar13 + 1;
      } while (psVar13 != local_180);
    }
    local_130._M_buckets = &local_130._M_single_bucket;
    local_130._M_bucket_count = 1;
    local_130._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_130._M_element_count = 0;
    local_130._M_rehash_policy._M_max_load_factor = 1.0;
    local_130._M_rehash_policy._M_next_resize = 0;
    local_130._M_single_bucket = (__node_base_ptr)0x0;
    if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        local_f8._M_impl.super__Deque_impl_data._M_start._M_cur) {
      do {
        local_1b0.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             ((local_f8._M_impl.super__Deque_impl_data._M_start._M_cur)->
             super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_1b0.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = ((local_f8._M_impl.super__Deque_impl_data._M_start._M_cur)->
                super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                _M_pi;
        if (local_1b0.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_1b0.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_1b0.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_1b0.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_1b0.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        std::
        deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
        ::pop_front((deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                     *)&local_f8);
        local_1a0.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)local_1b0.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_emplace<unsigned_long>(&local_130,&local_1a0);
        ir::getOperandsUsed(&local_1a0,&local_1b0);
        psVar6 = local_1a0.
                 super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (peVar10 = (element_type *)
                       local_1a0.
                       super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; peVar10 != (element_type *)psVar6;
            peVar10 = peVar10 + 1) {
          ir::dycLocalReg((ir *)&local_170,(shared_ptr<mocker::ir::Addr> *)peVar10);
          if (local_170 != 0) {
            cVar11 = std::
                     _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(local_178,(key_type *)&local_170);
            if (cVar11.
                super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_true>
                ._M_cur == (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
            }
            local_1c0.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(element_type **)
                  ((long)cVar11.
                         super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_true>
                         ._M_cur + 0x20);
            local_1c0.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                      ((long)cVar11.
                             super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_true>
                             ._M_cur + 0x28);
            if (local_1c0.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_1c0.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_1c0.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_1c0.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_1c0.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            p_Var5 = local_130._M_buckets
                     [(ulong)local_1c0.
                             super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr % local_130._M_bucket_count];
            p_Var12 = (__node_base_ptr)0x0;
            if ((p_Var5 != (__node_base_ptr)0x0) &&
               (p_Var12 = p_Var5, p_Var15 = p_Var5->_M_nxt,
               (element_type *)p_Var5->_M_nxt[1]._M_nxt !=
               local_1c0.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr))
            {
              while (p_Var4 = p_Var15->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
                p_Var12 = (__node_base_ptr)0x0;
                if (((ulong)p_Var4[1]._M_nxt % local_130._M_bucket_count !=
                     (ulong)local_1c0.
                            super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr % local_130._M_bucket_count) ||
                   (p_Var12 = p_Var15, p_Var15 = p_Var4,
                   (element_type *)p_Var4[1]._M_nxt ==
                   local_1c0.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)) goto LAB_00112b0d;
              }
              p_Var12 = (__node_base_ptr)0x0;
            }
LAB_00112b0d:
            if ((p_Var12 == (__node_base_ptr)0x0) || (p_Var12->_M_nxt == (_Hash_node_base *)0x0)) {
              std::
              deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
              ::emplace_back<std::shared_ptr<mocker::ir::IRInst>&>
                        ((deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
                          *)&local_f8,&local_1c0);
            }
            if (local_1c0.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1c0.
                         super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          if (local_168 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_168);
          }
        }
        std::
        vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ::~vector(&local_1a0);
        if (local_1b0.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1b0.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      } while (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_f8._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    intersectSet<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>
              ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)&local_a0,
               (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)&local_130);
    __return_storage_ptr__ =
         (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *)local_188;
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_Hashtable(local_188,&local_a0);
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_130);
    if (local_148 != (code *)0x0) {
      (*local_148)(&local_158,&local_158,3);
    }
    if (local_1e8 != (size_t *)0x0) {
      operator_delete(local_1e8,local_1d8 - (long)local_1e8);
    }
  }
  else {
    (__return_storage_ptr__->_M_h)._M_buckets = (__buckets_ptr)0x0;
    (__return_storage_ptr__->_M_h)._M_bucket_count = 0;
    *(undefined8 *)&(__return_storage_ptr__->_M_h)._M_rehash_policy = 0;
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
    (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__return_storage_ptr__->_M_h)._M_element_count = 0;
    (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
    (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
    (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  }
  if (local_1c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c8);
  }
  std::
  deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
  ::~deque((deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
            *)&local_f8);
  std::
  _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Reg>,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>,_std::__detail::_Identity,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_a0);
  return (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *)&__return_storage_ptr__->_M_h;
}

Assistant:

std::unordered_set<ir::InstID>
LoopInvariantCodeMotion::findLoopInvariantComputation(
    std::size_t header, const UseDefChain &useDef) {
  const auto &loopNodes = loopTree.getLoops().at(header);

  std::unordered_set<ir::InstID> res;

  auto loopInvVars = loopTree.getLoopInvariantVariables(header);
  std::queue<std::shared_ptr<ir::IRInst>> worklist;

  // we only hoist Calls that can not be avoided
  auto &headerBB = func.getBasicBlock(header);
  auto br = ir::dyc<ir::Branch>(headerBB.getInsts().back());
  auto thenLabel = br->getThen()->getID(), elseLabel = br->getElse()->getID();

  if (isIn(loopNodes, elseLabel))
    std::swap(thenLabel, elseLabel);

  if (isIn(loopNodes, elseLabel))
    return {};

  std::vector<std::size_t> mustPass;
  std::function<void(std::size_t)> visit = [&visit, &mustPass,
                                            this](std::size_t cur) {
    mustPass.emplace_back(cur);
    auto succs = func.getBasicBlock(cur).getSuccessors();
    if (succs.size() != 1)
      return;
    visit(succs.at(0));
  };
  visit(thenLabel);

  for (auto &node : mustPass) {
    const auto &bb = func.getBasicBlock(node);
    for (auto &inst : bb.getInsts()) {
      auto dest = ir::getDest(inst);
      if (!dest || !isIn(loopInvVars, dest))
        continue;
      res.emplace(inst->getID());
      if (auto call = ir::dyc<ir::Call>(inst)) {
        worklist.emplace(inst);
      }
    }
  }

  std::unordered_set<ir::InstID> related;
  while (!worklist.empty()) {
    auto inst = worklist.front();
    worklist.pop();
    related.emplace(inst->getID());
    auto operands = ir::getOperandsUsed(inst);
    for (auto &operand : operands) {
      if (auto reg = ir::dycLocalReg(operand)) {
        auto def = useDef.getDef(reg).getInst();
        if (!isIn(related, def->getID()))
          worklist.emplace(def);
      }
    }
  }

  intersectSet(res, related);
  return res;
}